

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int nn_req_csend(nn_sockbase *self,nn_msg *msg)

{
  size_t sVar1;
  uint8_t *buf;
  nn_chunkref *in_RSI;
  nn_msg *in_RDI;
  nn_chunkref *unaff_retaddr;
  nn_req *req;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  nn_msg *self_00;
  nn_msg *dst;
  
  self_00 = in_RDI;
  if (in_RDI == (nn_msg *)0x0) {
    self_00 = (nn_msg *)0x0;
  }
  *(int *)((long)&self_00[9].hdrs.u + 8) = *(int *)((long)&self_00[9].hdrs.u + 8) + 1;
  dst = self_00;
  sVar1 = nn_chunkref_size(&self_00->sphdr);
  if (sVar1 == 0) {
    nn_chunkref_term(&dst->sphdr);
    nn_chunkref_init(unaff_retaddr,(size_t)in_RDI);
    buf = (uint8_t *)nn_chunkref_data(in_RSI);
    nn_putl(buf,*(uint *)((long)&self_00[9].hdrs.u + 8) | 0x80000000);
    nn_msg_term((nn_msg *)0x159ab1);
    nn_msg_mv(dst,(nn_msg *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    nn_fsm_action((nn_fsm *)dst,in_stack_ffffffffffffffdc);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
          ,0xf0);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_req_csend (struct nn_sockbase *self, struct nn_msg *msg)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, xreq.sockbase);

    /*  Generate new request ID for the new request and put it into message
        header. The most important bit is set to 1 to indicate that this is
        the bottom of the backtrace stack. */
    ++req->task.id;
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 4);
    nn_putl (nn_chunkref_data (&msg->sphdr), req->task.id | 0x80000000);

    /*  Store the message so that it can be re-sent if there's no reply. */
    nn_msg_term (&req->task.request);
    nn_msg_mv (&req->task.request, msg);

    /*  Notify the state machine. */
    nn_fsm_action (&req->fsm, NN_REQ_ACTION_SENT);

    return 0;
}